

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

char * sx_os_path_normcase(char *dst,int size,char *path)

{
  char *path_local;
  int size_local;
  char *dst_local;
  
  if (dst != path) {
    sx_strcpy(dst,size,path);
  }
  return dst;
}

Assistant:

char* sx_os_path_normcase(char* dst, int size, const char* path)
{
#if SX_PLATFORM_WINDOWS
    return sx_tolower(dst, size, path);
#else
    if (dst != path)
        sx_strcpy(dst, size, path);
    return dst;
#endif
}